

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::qr_solve
          (Epnp *this,Matrix<double,_6,_4,_0,_6,_4> *A_orig,Matrix<double,_6,_1,_0,_6,_1> *b,
          Matrix<double,_4,_1,_0,_4,_1> *X)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  double dVar7;
  double *pdVar8;
  long lVar9;
  ostream *poVar10;
  ulong *puVar11;
  double *pdVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  uint uVar17;
  long lVar18;
  ulong *puVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  PlainObjectBase<Eigen::Matrix<double,4,6,0,4,6>> *pPVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  Matrix<double,_4,_6,_0,_4,_6> A;
  Matrix<double,_6,_4,_0,_6,_4> *local_148;
  PlainObjectBase<Eigen::Matrix<double,4,6,0,4,6>> local_140 [8];
  ulong local_138 [33];
  
  pPVar23 = local_140;
  local_148 = A_orig;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,6,0,4,6>>::
  _set_noalias<Eigen::Transpose<Eigen::Matrix<double,6,4,0,6,4>>>
            (pPVar23,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>_> *)
                     &local_148);
  if (qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
      ::max_nr == '\0') {
    qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
    ::max_nr = '\x01';
    qr_solve::A1 = (double *)operator_new__(0x30);
    qr_solve::A2 = (double *)operator_new__(0x30);
  }
  lVar21 = 0x30;
  lVar18 = 1;
  auVar38 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  iVar14 = 0xa0;
  iVar22 = 0xc0;
  puVar19 = local_138;
  auVar39 = ZEXT864(0) << 0x40;
  uVar20 = 0;
  while( true ) {
    pdVar12 = qr_solve::A1;
    if (uVar20 == 4) {
      pPVar23 = local_140;
      pdVar16 = (double *)b;
      for (lVar18 = 0; pdVar8 = qr_solve::A2, lVar18 != 4; lVar18 = lVar18 + 1) {
        auVar28 = ZEXT816(0) << 0x40;
        for (lVar9 = 0; lVar21 != lVar9; lVar9 = lVar9 + 8) {
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(pPVar23 + lVar9 * 4);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)((long)pdVar16 + lVar9);
          auVar28 = vfmadd231sd_fma(auVar28,auVar34,auVar4);
        }
        auVar30._8_8_ = auVar28._8_8_ ^ 0x8000000000000000;
        auVar30._0_8_ = -auVar28._0_8_ / pdVar12[lVar18];
        for (lVar9 = 0; lVar21 != lVar9; lVar9 = lVar9 + 8) {
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(pPVar23 + lVar9 * 4);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)((long)pdVar16 + lVar9);
          auVar28 = vfmadd213sd_fma(auVar35,auVar30,auVar28);
          *(long *)((long)pdVar16 + lVar9) = auVar28._0_8_;
        }
        pPVar23 = pPVar23 + 0x28;
        lVar21 = lVar21 + -8;
        pdVar16 = pdVar16 + 1;
      }
      pdVar12 = (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
                array + 3;
      (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
           (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
           [3] / qr_solve::A2[3];
      lVar21 = 8;
      uVar17 = 8;
      for (uVar13 = 2; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
        uVar20 = (ulong)uVar13;
        auVar28 = ZEXT816(0);
        for (lVar18 = 0; lVar21 != lVar18; lVar18 = lVar18 + 8) {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)((long)local_138 + lVar18 + uVar20 * 8 + (ulong)uVar17 * 8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)pdVar12 + lVar18);
          auVar28 = vfmadd231sd_fma(auVar28,auVar36,auVar3);
        }
        lVar21 = lVar21 + 8;
        pdVar12 = pdVar12 + -1;
        uVar17 = uVar17 - 4;
        (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
        [uVar20] = ((b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.
                    m_data.array[uVar20] - auVar28._0_8_) / pdVar8[uVar20];
      }
      return;
    }
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)pPVar23;
    lVar9 = 0;
    auVar28 = vandpd_avx(auVar26,auVar38._0_16_);
    while (dVar7 = auVar28._0_8_, iVar14 != (int)lVar9) {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(pPVar23 + lVar9);
      lVar9 = lVar9 + 0x20;
      auVar4 = vandpd_avx(auVar27,auVar38._0_16_);
      auVar28 = vmaxsd_avx(auVar4,auVar28);
    }
    if ((dVar7 == 0.0) && (!NAN(dVar7))) break;
    auVar28 = ZEXT816(0) << 0x40;
    for (lVar9 = 0; iVar22 != (int)lVar9; lVar9 = lVar9 + 0x20) {
      dVar25 = (1.0 / dVar7) * *(double *)(pPVar23 + lVar9);
      *(double *)(pPVar23 + lVar9) = dVar25;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar25;
      auVar28 = vfmadd231sd_fma(auVar28,auVar37,auVar37);
    }
    if (auVar28._0_8_ < 0.0) {
      dVar25 = sqrt(auVar28._0_8_);
      auVar38 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      auVar39 = ZEXT864(0) << 0x40;
    }
    else {
      auVar28 = vsqrtsd_avx(auVar28,auVar28);
      dVar25 = auVar28._0_8_;
    }
    pdVar12 = qr_solve::A1;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(double *)pPVar23;
    uVar5 = vcmpsd_avx512f(auVar31,auVar39._0_16_,1);
    bVar6 = (bool)((byte)uVar5 & 1);
    dVar24 = (double)((ulong)bVar6 * (long)-dVar25 + (ulong)!bVar6 * (long)dVar25);
    dVar25 = *(double *)pPVar23 + dVar24;
    *(double *)pPVar23 = dVar25;
    qr_solve::A1[uVar20] = dVar24 * dVar25;
    qr_solve::A2[uVar20] = dVar24 * -dVar7;
    puVar11 = puVar19;
    for (lVar9 = lVar18; lVar9 != 4; lVar9 = lVar9 + 1) {
      auVar28 = ZEXT816(0) << 0x40;
      for (lVar15 = 0; iVar22 != (int)lVar15; lVar15 = lVar15 + 0x20) {
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(pPVar23 + lVar15);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)((long)puVar11 + lVar15);
        auVar28 = vfmadd231sd_fma(auVar28,auVar32,auVar1);
      }
      auVar29._8_8_ = auVar28._8_8_ ^ 0x8000000000000000;
      auVar29._0_8_ = -auVar28._0_8_ / pdVar12[uVar20];
      for (lVar15 = 0; iVar22 != (int)lVar15; lVar15 = lVar15 + 0x20) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(pPVar23 + lVar15);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((long)puVar11 + lVar15);
        auVar28 = vfmadd213sd_fma(auVar33,auVar29,auVar2);
        *(long *)((long)puVar11 + lVar15) = auVar28._0_8_;
      }
      puVar11 = puVar11 + 1;
    }
    pPVar23 = pPVar23 + 0x28;
    lVar18 = lVar18 + 1;
    iVar14 = iVar14 + -0x20;
    iVar22 = iVar22 + -0x20;
    puVar19 = puVar19 + 5;
    uVar20 = uVar20 + 1;
  }
  qr_solve::A2[uVar20 & 0xffffffff] = 0.0;
  qr_solve::A1[uVar20 & 0xffffffff] = 0.0;
  poVar10 = std::operator<<((ostream *)&std::cerr,
                            "God damnit, A is singular, this shouldn\'t happen.");
  std::endl<char,std::char_traits<char>>(poVar10);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::qr_solve(
    Eigen::Matrix<double,6,4> & A_orig,
    Eigen::Matrix<double,6,1> & b,
    Eigen::Matrix<double,4,1> & X)
{
  Eigen::Matrix<double,4,6> A = A_orig.transpose();

  static int max_nr = 0;
  static double * A1, * A2;

  const int nr = A_orig.rows();
  const int nc = A_orig.cols();

  if (max_nr != 0 && max_nr < nr)
  {
    delete [] A1;
    delete [] A2;
  }
  if (max_nr < nr)
  {
    max_nr = nr;
    A1 = new double[nr];
    A2 = new double[nr];
  }

  double * pA = A.data(), * ppAkk = pA;
  for(int k = 0; k < nc; k++)
  {
    double * ppAik = ppAkk, eta = fabs(*ppAik);
    for(int i = k + 1; i < nr; i++)
    {
      double elt = fabs(*ppAik);
      if (eta < elt) eta = elt;
      ppAik += nc;
    }

    if (eta == 0)
    {
      A1[k] = A2[k] = 0.0;
      cerr << "God damnit, A is singular, this shouldn't happen." << endl;
      return;
    }
    else
    {
      double * ppAik = ppAkk, sum = 0.0, inv_eta = 1. / eta;
      for(int i = k; i < nr; i++)
      {
        *ppAik *= inv_eta;
        sum += *ppAik * *ppAik;
        ppAik += nc;
      }
      double sigma = sqrt(sum);
      if (*ppAkk < 0)
        sigma = -sigma;
      *ppAkk += sigma;
      A1[k] = sigma * *ppAkk;
      A2[k] = -eta * sigma;
      for(int j = k + 1; j < nc; j++)
      {
        double * ppAik = ppAkk, sum = 0;
        for(int i = k; i < nr; i++)
        {
          sum += *ppAik * ppAik[j - k];
          ppAik += nc;
        }
        double tau = sum / A1[k];
        ppAik = ppAkk;
        for(int i = k; i < nr; i++)
        {
          ppAik[j - k] -= tau * *ppAik;
          ppAik += nc;
        }
      }
    }
    ppAkk += nc + 1;
  }

  // b <- Qt b
  double * ppAjj = pA, * pb = b.data();
  for(int j = 0; j < nc; j++)
  {
    double * ppAij = ppAjj, tau = 0;
    for(int i = j; i < nr; i++)
    {
      tau += *ppAij * pb[i];
      ppAij += nc;
    }
    tau /= A1[j];
    ppAij = ppAjj;
    for(int i = j; i < nr; i++)
    {
      pb[i] -= tau * *ppAij;
      ppAij += nc;
    }
    ppAjj += nc + 1;
  }

  // X = R-1 b
  double * pX = X.data();
  pX[nc - 1] = pb[nc - 1] / A2[nc - 1];
  for(int i = nc - 2; i >= 0; i--)
  {
    double * ppAij = pA + i * nc + (i + 1), sum = 0;

    for(int j = i + 1; j < nc; j++)
    {
      sum += *ppAij * pX[j];
      ppAij++;
    }
    pX[i] = (pb[i] - sum) / A2[i];
  }
}